

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_ecc_weierstrass_multiply(void)

{
  WeierstrassCurve *wc;
  WeierstrassPoint *wp;
  mp_int *x;
  size_t sVar1;
  WeierstrassPoint *pWVar2;
  size_t i;
  ulong index;
  
  wc = wcurve();
  wp = ecc_weierstrass_point_new_identity(wc);
  x = mp_new(0x38);
  index = 1;
  while( true ) {
    sVar1 = (*looplimit)(5);
    if (sVar1 <= index) break;
    pWVar2 = wpoint(wc,index);
    ecc_weierstrass_point_copy_into(wp,pWVar2);
    ecc_weierstrass_point_free(pWVar2);
    mp_random_fill(x);
    log_start();
    pWVar2 = ecc_weierstrass_multiply(wp,x);
    log_end();
    ecc_weierstrass_point_free(pWVar2);
    index = index + 1;
  }
  ecc_weierstrass_point_free(wp);
  ecc_weierstrass_curve_free(wc);
  mp_free(x);
  return;
}

Assistant:

static void test_ecc_weierstrass_multiply(void)
{
    WeierstrassCurve *wc = wcurve();
    WeierstrassPoint *a = ecc_weierstrass_point_new_identity(wc);
    mp_int *exponent = mp_new(56);
    for (size_t i = 1; i < looplimit(5); i++) {
        WeierstrassPoint *A = wpoint(wc, i);
        ecc_weierstrass_point_copy_into(a, A);
        ecc_weierstrass_point_free(A);
        mp_random_fill(exponent);

        log_start();
        WeierstrassPoint *r = ecc_weierstrass_multiply(a, exponent);
        log_end();

        ecc_weierstrass_point_free(r);
    }
    ecc_weierstrass_point_free(a);
    ecc_weierstrass_curve_free(wc);
    mp_free(exponent);
}